

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

char * helicsEndpointGetInfo(HelicsEndpoint end)

{
  EndpointObject *pEVar1;
  string *info;
  EndpointObject *endObj;
  Interface *in_stack_ffffffffffffffd0;
  HelicsEndpoint in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (pEVar1 == (EndpointObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  else {
    helics::Interface::getInfo_abi_cxx11_(in_stack_ffffffffffffffd0);
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

const char* helicsEndpointGetInfo(HelicsEndpoint end)
{
    auto* endObj = verifyEndpoint(end, nullptr);
    if (endObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = endObj->endPtr->getInfo();
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}